

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int cram_seek(cram_fd *fd,off_t offset,int whence)

{
  hFILE *fp;
  int iVar1;
  off_t oVar2;
  ulong __n;
  ulong nbytes;
  ulong uVar3;
  char buf [65536];
  undefined1 auStack_10038 [65544];
  
  fd->ooc = 0;
  oVar2 = hseek(fd->fp,offset,whence);
  if (oVar2 < 0) {
    if (-1 < offset && whence == 1) {
      do {
        if (offset < 1) goto LAB_00131d77;
        nbytes = 0x10000;
        if ((ulong)offset < 0x10000) {
          nbytes = offset;
        }
        fp = fd->fp;
        uVar3 = (long)fp->end - (long)fp->begin;
        __n = nbytes;
        if (uVar3 < nbytes) {
          __n = uVar3;
        }
        memcpy(auStack_10038,fp->begin,__n);
        fp->begin = fp->begin + __n;
        if (uVar3 < nbytes) {
          __n = hread2(fp,auStack_10038,nbytes,__n);
        }
        offset = offset - nbytes;
      } while (nbytes == __n);
    }
    iVar1 = -1;
  }
  else {
LAB_00131d77:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cram_seek(cram_fd *fd, off_t offset, int whence) {
    char buf[65536];

    fd->ooc = 0;

    if (hseek(fd->fp, offset, whence) >= 0)
	return 0;

    if (!(whence == SEEK_CUR && offset >= 0))
	return -1;

    /* Couldn't fseek, but we're in SEEK_CUR mode so read instead */
    while (offset > 0) {
	int len = MIN(65536, offset);
	if (len != hread(fd->fp, buf, len))
	    return -1;
	offset -= len;
    }

    return 0;
}